

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

BOOL __thiscall
Js::TypedArrayBase::SetProperty
          (TypedArrayBase *this,PropertyId propertyId,Var value,PropertyOperationFlags flags,
          PropertyValueInfo *info)

{
  ScriptContext *this_00;
  uint32 uVar1;
  BOOL BVar2;
  PropertyRecord *this_01;
  
  this_00 = (((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  this_01 = ScriptContext::GetPropertyName(this_00,propertyId);
  if (this_01->isNumeric == true) {
    uVar1 = PropertyRecord::GetNumericValue(this_01);
    (*(this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x70])
              (this,(ulong)uVar1,value);
    return 1;
  }
  if ((this_01->isSymbol == false) &&
     (BVar2 = CanonicalNumericIndexString(propertyId,this_00), BVar2 != 0)) {
    return 0;
  }
  BVar2 = DynamicObject::SetProperty((DynamicObject *)this,propertyId,value,flags,info);
  return BVar2;
}

Assistant:

BOOL TypedArrayBase::SetProperty(PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        ScriptContext *scriptContext = GetScriptContext();

        const PropertyRecord* propertyRecord = scriptContext->GetPropertyName(propertyId);
        if (propertyRecord->IsNumeric())
        {
            this->DirectSetItem(propertyRecord->GetNumericValue(), value);
            return true;
        }

        if (!propertyRecord->IsSymbol() && CanonicalNumericIndexString(propertyId, scriptContext))
        {
            return FALSE;
        }
        else
        {
            return DynamicObject::SetProperty(propertyId, value, flags, info);
        }
    }